

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::MissMatchObjectTest::MissMatchObjectTest
          (MissMatchObjectTest *this,Context *context)

{
  long lVar1;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"missmatch_object",
             "Test verifies if INVALID_VALUE is generated when object & target provided to CopySubImageData do not match"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MissMatchObjectTest_01db4d90;
  this->m_dst_name = 0;
  this->m_src_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    std::
    vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
    ::push_back(&this->m_test_cases,
                (value_type *)((long)&MissMatchObjectTest::test_cases[0].m_obj_target + lVar1));
  }
  return;
}

Assistant:

MissMatchObjectTest::MissMatchObjectTest(deqp::Context& context)
	: TestCase(
		  context, "missmatch_object",
		  "Test verifies if INVALID_VALUE is generated when object & target provided to CopySubImageData do not match")
	, m_dst_name(0)
	, m_src_name(0)
	, m_test_case_index(0)
{
	static const testCase test_cases[] = { { GL_TEXTURE_2D, GL_TEXTURE_2D, GL_TEXTURE_2D, GL_NO_ERROR },
										   { GL_TEXTURE_2D, GL_RENDERBUFFER, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_TEXTURE_2D, GL_TEXTURE_2D, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_TEXTURE_2D, GL_RENDERBUFFER, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_TEXTURE_2D, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_RENDERBUFFER, GL_TEXTURE_2D, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_TEXTURE_2D, GL_RENDERBUFFER, GL_INVALID_VALUE },
										   { GL_RENDERBUFFER, GL_RENDERBUFFER, GL_RENDERBUFFER, GL_NO_ERROR } };

	static const GLuint n_test_cases = sizeof(test_cases) / sizeof(testCase);

	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		const testCase& test_case = test_cases[i];

		m_test_cases.push_back(test_case);
	}
}